

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell::
TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
          (TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
           *this)

{
  TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
  *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell_00346cf8
  ;
  return;
}

Assistant:

TEST(MockReturnValueTest, BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    bool ret_value = true;
    bool another_ret_value = false;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    CHECK_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getBoolValue());
    CHECK_EQUAL(ret_value, mock().returnValue().getBoolValue());
    CHECK_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getBoolValue());
    CHECK_EQUAL(another_ret_value, mock().returnValue().getBoolValue());
}